

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::ColumnChunk::read(ColumnChunk *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  _func_int **pp_Var7;
  undefined8 *puVar8;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  ushort local_a2;
  uint local_a0;
  int local_9c;
  string *local_98;
  int64_t *local_90;
  ColumnMetaData *local_88;
  int64_t *local_80;
  int32_t *local_78;
  int64_t *local_70;
  int32_t *local_68;
  ColumnCryptoMetaData *local_60;
  string *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->encrypted_column_metadata;
  local_60 = &this->crypto_metadata;
  local_68 = &this->column_index_length;
  local_70 = &this->column_index_offset;
  local_78 = &this->offset_index_length;
  local_80 = &this->offset_index_offset;
  local_88 = &this->meta_data;
  local_90 = &this->file_offset;
  local_98 = &this->file_path;
  local_a0 = 0;
  do {
    __nbytes_00 = &local_a2;
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_9c);
    if (local_9c == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if ((local_a0 & 1) == 0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar8[1] = puVar8 + 3;
        puVar8[2] = 0;
        *(undefined1 *)(puVar8 + 3) = 0;
        *puVar8 = &PTR__TException_02482330;
        *(undefined4 *)(puVar8 + 5) = 1;
        __cxa_throw(puVar8,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    switch(local_a2) {
    case 1:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 0xb) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x2a])(this_00,local_98);
      bVar1 = 1;
      break;
    case 2:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 10) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x28])(this_00,local_90);
      local_a0 = (uint)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
      goto LAB_01caaaff;
    case 3:
      if (local_9c != 0xc) goto switchD_01caa9cc_default;
      sVar6 = ColumnMetaData::read(local_88,__fd,__buf_00,(size_t)__nbytes_00);
      iVar4 = (int)sVar6;
      bVar1 = 2;
      break;
    case 4:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 10) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x28])(this_00,local_80);
      bVar1 = 4;
      break;
    case 5:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 8) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x27])(this_00,local_78);
      bVar1 = 8;
      break;
    case 6:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 10) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x28])(this_00,local_70);
      bVar1 = 0x10;
      break;
    case 7:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 8) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x27])(this_00,local_68);
      bVar1 = 0x20;
      break;
    case 8:
      if (local_9c != 0xc) goto switchD_01caa9cc_default;
      sVar6 = ColumnCryptoMetaData::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
      iVar4 = (int)sVar6;
      bVar1 = 0x40;
      break;
    case 9:
      pp_Var7 = this_00->_vptr_TProtocol;
      if (local_9c != 0xb) goto LAB_01caaaf3;
      iVar4 = (*pp_Var7[0x2b])(this_00,local_58);
      bVar1 = 0x80;
      break;
    default:
switchD_01caa9cc_default:
      pp_Var7 = this_00->_vptr_TProtocol;
LAB_01caaaf3:
      iVar4 = (*pp_Var7[0x2c])(this_00);
      goto LAB_01caaaff;
    }
    this->__isset = (_ColumnChunk__isset)((byte)this->__isset | bVar1);
LAB_01caaaff:
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t ColumnChunk::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_file_offset = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->file_path);
          this->__isset.file_path = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->file_offset);
          isset_file_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->meta_data.read(iprot);
          this->__isset.meta_data = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->offset_index_offset);
          this->__isset.offset_index_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->offset_index_length);
          this->__isset.offset_index_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->column_index_offset);
          this->__isset.column_index_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->column_index_length);
          this->__isset.column_index_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->crypto_metadata.read(iprot);
          this->__isset.crypto_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->encrypted_column_metadata);
          this->__isset.encrypted_column_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_file_offset)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}